

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

bool __thiscall chatra::Thread::initializeVars(Thread *this)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  pointer pFVar4;
  reference ppTVar5;
  ObjectBase *pOVar6;
  Class *this_00;
  reference ppCVar7;
  Package *package;
  Node *node;
  reference ppTVar8;
  size_type sVar9;
  Method *method;
  __normal_iterator<chatra::Frame_*,_std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>_>
  local_110;
  __normal_iterator<chatra::Frame_*,_std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>_>
  local_108;
  Reference local_100;
  undefined1 local_f1;
  iterator iStack_f0;
  bool isNative;
  __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
  local_e8;
  TemporaryObject *local_e0;
  TemporaryObject *argsValue;
  __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
  local_d0;
  TemporaryObject *local_c8;
  TemporaryObject *methodValue;
  __normal_iterator<chatra::Frame_*,_std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>_>
  local_b8;
  __normal_iterator<chatra::Frame_*,_std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>_>
  local_b0;
  reference local_a8;
  Frame *f0;
  ReferenceNode *local_98;
  int local_8c;
  Node *local_88;
  Class *local_80;
  Class *cl;
  const_reverse_iterator it;
  __normal_iterator<chatra::Frame_*,_std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>_>
  local_60;
  Reference local_58;
  Reference ref;
  __normal_iterator<chatra::Frame_*,_std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>_>
  local_48;
  __normal_iterator<chatra::Frame_*,_std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>_>
  local_40;
  Reference local_38;
  vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_> *local_30;
  vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_> *initializationOrder;
  unsigned_long *nodePhase;
  size_t callFrameCount;
  Thread *this_local;
  
  nodePhase = (unsigned_long *)0x3;
  callFrameCount = (size_t)this;
  pvVar2 = std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>::back(&this->frames);
  pvVar3 = std::
           vector<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
           ::back(&pvVar2->stack);
  initializationOrder =
       (vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_> *)&pvVar3->second;
  if (*(unsigned_long *)initializationOrder == 0) {
    *(unsigned_long *)initializationOrder = *(unsigned_long *)initializationOrder + 1;
    pvVar2 = std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>::back(&this->frames);
    Lock::prepareToMethodCall(pvVar2->lock);
    ref.node = (ReferenceNode *)
               std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>::end(&this->frames);
    local_48 = __gnu_cxx::
               __normal_iterator<chatra::Frame_*,_std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>_>
               ::operator-((__normal_iterator<chatra::Frame_*,_std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>_>
                            *)&ref,3);
    local_40 = __gnu_cxx::
               __normal_iterator<chatra::Frame_*,_std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>_>
               ::operator-(&local_48,1);
    pFVar4 = __gnu_cxx::
             __normal_iterator<chatra::Frame_*,_std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>_>
             ::operator->(&local_40);
    ppTVar5 = std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>::
              back(&pFVar4->values);
    local_38 = TemporaryObject::getRef(*ppTVar5);
    pOVar6 = Reference::deref<chatra::ObjectBase>(&local_38);
    this_00 = ObjectBase::getClass(pOVar6);
    local_30 = Class::refInitializationOrder(this_00);
    it.current._M_current =
         (__normal_iterator<const_chatra::Class_*const_*,_std::vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>_>
          )std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>::end(&this->frames);
    local_60 = __gnu_cxx::
               __normal_iterator<chatra::Frame_*,_std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>_>
               ::operator-((__normal_iterator<chatra::Frame_*,_std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>_>
                            *)&it,2);
    pFVar4 = __gnu_cxx::
             __normal_iterator<chatra::Frame_*,_std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>_>
             ::operator->(&stack0xffffffffffffffa0);
    local_58 = Frame::getSelf(pFVar4);
    std::vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>::crbegin
              ((vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_> *)
               &stack0xffffffffffffff90);
    while( true ) {
      std::vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>::crend
                ((vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_> *)&cl);
      bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_chatra::Class_*const_*,_std::vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>_>_>
                               *)&stack0xffffffffffffff90,
                              (reverse_iterator<__gnu_cxx::__normal_iterator<const_chatra::Class_*const_*,_std::vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>_>_>
                               *)&cl);
      if (!bVar1) break;
      ppCVar7 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<const_chatra::Class_*const_*,_std::vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>_>_>
                ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_chatra::Class_*const_*,_std::vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>_>_>
                             *)&stack0xffffffffffffff90);
      local_80 = *ppCVar7;
      pvVar2 = std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>::back(&this->frames);
      local_88 = (Node *)popValueNode;
      local_8c = 0;
      std::
      vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
      ::emplace_back<chatra::Node*,int>
                ((vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
                  *)&pvVar2->stack,&local_88,&local_8c);
      package = Class::getPackage(local_80);
      node = Class::getNode(local_80);
      local_98 = local_58.node;
      constructFrames(this,package,node,local_80,local_58);
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<const_chatra::Class_*const_*,_std::vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_chatra::Class_*const_*,_std::vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>_>_>
                    *)&f0,(int)&stack0xffffffffffffff90);
    }
    checkTransferReq(this);
    RuntimeImp::enqueue(this->runtime,this);
    this_local._7_1_ = false;
  }
  else {
    pvVar2 = std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>::back(&this->frames);
    std::
    vector<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
    ::pop_back(&pvVar2->stack);
    methodValue = (TemporaryObject *)
                  std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>::end(&this->frames);
    local_b8 = __gnu_cxx::
               __normal_iterator<chatra::Frame_*,_std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>_>
               ::operator-((__normal_iterator<chatra::Frame_*,_std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>_>
                            *)&methodValue,3);
    local_b0 = __gnu_cxx::
               __normal_iterator<chatra::Frame_*,_std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>_>
               ::operator-(&local_b8,1);
    local_a8 = __gnu_cxx::
               __normal_iterator<chatra::Frame_*,_std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>_>
               ::operator*(&local_b0);
    argsValue = (TemporaryObject *)
                std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>::
                end(&local_a8->values);
    local_d0 = __gnu_cxx::
               __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
               ::operator-((__normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
                            *)&argsValue,2);
    ppTVar8 = __gnu_cxx::
              __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
              ::operator*(&local_d0);
    local_c8 = *ppTVar8;
    iStack_f0 = std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>::
                end(&local_a8->values);
    local_e8 = __gnu_cxx::
               __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
               ::operator-(&stack0xffffffffffffff10,3);
    ppTVar8 = __gnu_cxx::
              __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
              ::operator*(&local_e8);
    local_e0 = *ppTVar8;
    sVar9 = std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>::size(&this->frames);
    local_110._M_current =
         (Frame *)std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>::end(&this->frames);
    local_108 = __gnu_cxx::
                __normal_iterator<chatra::Frame_*,_std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>_>
                ::operator-(&local_110,2);
    pFVar4 = __gnu_cxx::
             __normal_iterator<chatra::Frame_*,_std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>_>
             ::operator->(&local_108);
    local_100 = Frame::getSelf(pFVar4);
    pOVar6 = Reference::deref<chatra::ObjectBase>(&local_100);
    local_f1 = invokeNativeMethod<chatra::Thread::initializeVars()::__0>
                         (this,sVar9 - 4,pOVar6,local_c8,local_e0,(anon_class_8_1_8991fb9c)this);
    if ((bool)local_f1) {
      this_local._7_1_ = false;
    }
    else {
      method = TemporaryObject::getRefMethod(local_c8);
      importMethodArguments(this,method,local_e0,(TemporaryObject *)0x0);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Thread::initializeVars() {
	constexpr size_t callFrameCount = 3;
	auto& nodePhase = frames.back().stack.back().second;

	switch (nodePhase) {
	case 0: {
		nodePhase++;
		frames.back().lock->prepareToMethodCall();

		auto& initializationOrder = (frames.end() - callFrameCount - 1)->values.back()->getRef().deref<ObjectBase>().getClass()->refInitializationOrder();
		auto ref = (frames.end() - 2)->getSelf();
		for (auto it = initializationOrder.crbegin(); it != initializationOrder.crend(); it++) {
			auto* cl = *it;
			frames.back().stack.emplace_back(&popValueNode, 0);
			constructFrames(cl->getPackage(), cl->getNode(), cl, ref);
		}

		checkTransferReq();
		runtime.enqueue(this);
		return false;
	}

	default: {
		frames.back().stack.pop_back();
		auto& f0 = *(frames.end() - callFrameCount - 1);
		auto* methodValue = *(f0.values.end() - 2);
		auto* argsValue = *(f0.values.end() - 3);

		auto isNative = invokeNativeMethod(frames.size() - callFrameCount - 1, &(frames.end() - 2)->getSelf().deref<ObjectBase>(),
				methodValue, argsValue, [&]() { pop(); });
		if (isNative)
			return false;

		importMethodArguments(methodValue->getRefMethod(), argsValue);
		return true;
	}
	}
}